

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O1

int LZ4_saveDictHC(LZ4_streamHC_t *LZ4_streamHCPtr,char *safeBuffer,int dictSize)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = (int)(LZ4_streamHCPtr->internal_donotuse).end -
          (*(int *)(LZ4_streamHCPtr->table + 0x8001) +
          (LZ4_streamHCPtr->internal_donotuse).dictLimit);
  uVar1 = 0x10000;
  if (dictSize < 0x10000) {
    uVar1 = dictSize;
  }
  uVar3 = 0;
  if (3 < dictSize) {
    uVar3 = uVar1;
  }
  if ((int)uVar2 <= (int)uVar3) {
    uVar3 = uVar2;
  }
  if (0 < (int)uVar3) {
    memmove(safeBuffer,(LZ4_streamHCPtr->internal_donotuse).end + -(ulong)uVar3,(ulong)uVar3);
  }
  uVar1 = (int)LZ4_streamHCPtr->table[0x8000] - (int)LZ4_streamHCPtr->table[0x8001];
  (LZ4_streamHCPtr->internal_donotuse).end = (LZ4_byte *)(safeBuffer + (int)uVar3);
  LZ4_streamHCPtr->table[0x8001] = safeBuffer + (int)uVar3 + -(ulong)uVar1;
  uVar1 = uVar1 - uVar3;
  (LZ4_streamHCPtr->internal_donotuse).dictLimit = uVar1;
  (LZ4_streamHCPtr->internal_donotuse).lowLimit = uVar1;
  if ((LZ4_streamHCPtr->internal_donotuse).nextToUpdate < uVar1) {
    (LZ4_streamHCPtr->internal_donotuse).nextToUpdate = uVar1;
  }
  return uVar3;
}

Assistant:

int LZ4_saveDictHC (LZ4_streamHC_t* LZ4_streamHCPtr, char* safeBuffer, int dictSize)
{
    LZ4HC_CCtx_internal* const streamPtr = &LZ4_streamHCPtr->internal_donotuse;
    int const prefixSize = (int)(streamPtr->end - (streamPtr->base + streamPtr->dictLimit));
    DEBUGLOG(5, "LZ4_saveDictHC(%p, %p, %d)", LZ4_streamHCPtr, safeBuffer, dictSize);
    assert(prefixSize >= 0);
    if (dictSize > 64 KB) dictSize = 64 KB;
    if (dictSize < 4) dictSize = 0;
    if (dictSize > prefixSize) dictSize = prefixSize;
    if (safeBuffer == NULL) assert(dictSize == 0);
    if (dictSize > 0)
        memmove(safeBuffer, streamPtr->end - dictSize, dictSize);
    {   U32 const endIndex = (U32)(streamPtr->end - streamPtr->base);
        streamPtr->end = (const BYTE*)safeBuffer + dictSize;
        streamPtr->base = streamPtr->end - endIndex;
        streamPtr->dictLimit = endIndex - (U32)dictSize;
        streamPtr->lowLimit = endIndex - (U32)dictSize;
        if (streamPtr->nextToUpdate < streamPtr->dictLimit)
            streamPtr->nextToUpdate = streamPtr->dictLimit;
    }
    return dictSize;
}